

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

boolean maybe_finished_meal(boolean stopping)

{
  if ((occupation == eatfood) && (victual.reqtime <= victual.usedtime)) {
    if (stopping != '\0') {
      occupation = (_func_int *)0x0;
    }
    eatfood();
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean maybe_finished_meal(boolean stopping)
{
	/* in case consume_oeaten() has decided that the food is all gone */
	if (occupation == eatfood && victual.usedtime >= victual.reqtime) {
	    if (stopping) occupation = 0;	/* for do_reset_eat */
	    eatfood(); /* calls done_eating() to use up victual.piece */
	    return TRUE;
	}
	return FALSE;
}